

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O3

void fe4_sub(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  unsigned_long_long t;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar4 = *arg1 - *arg2;
  uVar1 = (ulong)(*arg1 < *arg2);
  uVar3 = arg1[1] - arg2[1];
  uVar7 = uVar3 - uVar1;
  uVar1 = (ulong)(arg1[1] < arg2[1] || uVar3 < uVar1);
  uVar3 = arg1[2] - arg2[2];
  uVar8 = uVar3 - uVar1;
  uVar1 = (ulong)(arg1[2] < arg2[2] || uVar3 < uVar1);
  uVar3 = arg1[3] - arg2[3];
  uVar6 = uVar3 - uVar1;
  uVar5 = (ulong)(-(uint)(arg1[3] < arg2[3] || uVar3 < uVar1) & 0x26);
  uVar1 = (ulong)(uVar4 < uVar5);
  uVar3 = (ulong)(uVar7 < uVar1);
  uVar2 = (ulong)(uVar8 < uVar3);
  *out1 = (uVar4 - uVar5) - (ulong)(-(uint)(uVar6 < uVar2) & 0x26);
  out1[1] = uVar7 - uVar1;
  out1[2] = uVar8 - uVar3;
  out1[3] = uVar6 - uVar2;
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static void fe4_sub(uint64_t out1[4], const uint64_t arg1[4], const uint64_t arg2[4]) {
  uint64_t x1;
  uint64_t x2;
  fiat_uint1 x3;
  uint64_t x4;
  uint64_t x5;
  fiat_uint1 x6;
  uint64_t x7;
  uint64_t x8;
  fiat_uint1 x9;
  uint64_t x10;
  uint64_t x11;
  fiat_uint1 x12;
  uint64_t x13;
  uint64_t x14;
  fiat_uint1 x15;
  uint64_t x16;
  fiat_uint1 x17;
  uint64_t x18;
  fiat_uint1 x19;
  uint64_t x20;
  fiat_uint1 x21;
  uint64_t x22;
  uint64_t x23;
  fiat_uint1 x24;
  x1 = (arg2[0]);
  fiat_subborrowx_u64(&x2, &x3, 0x0, (arg1[0]), x1);
  x4 = (arg2[1]);
  fiat_subborrowx_u64(&x5, &x6, x3, (arg1[1]), x4);
  x7 = (arg2[2]);
  fiat_subborrowx_u64(&x8, &x9, x6, (arg1[2]), x7);
  x10 = (arg2[3]);
  fiat_subborrowx_u64(&x11, &x12, x9, (arg1[3]), x10);
  fiat_cmovznz_u64(&x13, x12, 0x0, UINT8_C(0x26)); // NOTE: clang 14 for Zen 2 uses sbb, and
  fiat_subborrowx_u64(&x14, &x15, 0x0, x2, x13);
  fiat_subborrowx_u64(&x16, &x17, x15, x5, 0x0);
  fiat_subborrowx_u64(&x18, &x19, x17, x8, 0x0);
  fiat_subborrowx_u64(&x20, &x21, x19, x11, 0x0);
  fiat_cmovznz_u64(&x22, x21, 0x0, UINT8_C(0x26)); // NOTE: clang 14 for Zen 2 uses sbb, and
  fiat_subborrowx_u64(&x23, &x24, 0x0, x14, x22);
  out1[0] = x23;
  out1[1] = x16;
  out1[2] = x18;
  out1[3] = x20;
}